

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_global.h
# Opt level: O3

vector<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
* __thiscall
lf::mesh::utils::
MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_unary_tests.cc:75:24)>
::operator()(vector<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
             *__return_storage_ptr__,
            MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_unary_tests_cc:75:24)>
            *this,Entity *e,MatrixXd *local)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  dim_t dVar4;
  DstEvaluatorType dstEvaluator;
  undefined4 extraout_var;
  Scalar *pSVar5;
  Scalar *pSVar6;
  vector<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
  *extraout_RAX;
  ActualDstType actualDst;
  long i;
  MatrixXd global_points;
  stringstream ss;
  string local_278;
  string local_258;
  string local_238;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_1f0;
  PointerType local_1b8;
  long lStack_1b0;
  ostream local_1a8 [8];
  XprTypeNested pMStack_1a0;
  long local_198;
  long lStack_190;
  Index local_188;
  
  iVar3 = (*this->_vptr_MeshFunctionGlobal[4])(this);
  dVar4 = base::internal::DimensionImpl((RefElType)iVar3);
  if (e[1]._vptr_Entity == (_func_int **)(ulong)dVar4) {
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Array<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Eigen::Array<double,_1,_-1,_1,_1,_-1>,_std::allocator<Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
    ::reserve(__return_storage_ptr__,(size_type)e[2]._vptr_Entity);
    iVar3 = (*this->_vptr_MeshFunctionGlobal[3])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
              (&local_258,(long *)CONCAT44(extraout_var,iVar3),e);
    if (0 < (long)e[2]._vptr_Entity) {
      i = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                  (&local_1f0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_258,i);
        local_188 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_outerStride;
        local_198 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_startRow.m_value;
        lStack_190 = local_1f0.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .m_startCol.m_value;
        local_1a8[0] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._16_1_;
        local_1a8[1] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._17_1_;
        local_1a8[2] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._18_1_;
        local_1a8[3] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._19_1_;
        local_1a8[4] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._20_1_;
        local_1a8[5] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._21_1_;
        local_1a8[6] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._22_1_;
        local_1a8[7] = (ostream)local_1f0.
                                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                                .
                                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                                ._23_1_;
        pMStack_1a0 = local_1f0.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .m_xpr;
        local_1b8 = local_1f0.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_data;
        lStack_1b0 = local_1f0.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     .m_rows.m_value;
        pSVar5 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                 ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                               *)&local_1b8,1);
        pSVar6 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>
                 ::operator[]((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                               *)&local_1b8,0);
        local_218 = *pSVar6;
        uStack_210 = 0;
        local_208 = *pSVar5;
        uStack_200 = 0;
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        local_278._M_dataplus._M_p = (pointer)Eigen::internal::aligned_malloc(0x10);
        local_278._M_string_length = 2;
        *(undefined4 *)local_278._M_dataplus._M_p = (undefined4)local_208;
        *(undefined4 *)(local_278._M_dataplus._M_p + 4) = local_208._4_4_;
        *(undefined4 *)(local_278._M_dataplus._M_p + 8) = (undefined4)local_218;
        *(uint *)(local_278._M_dataplus._M_p + 0xc) = local_218._4_4_ ^ 0x80000000;
        std::
        vector<Eigen::Array<double,1,-1,1,1,-1>,std::allocator<Eigen::Array<double,1,-1,1,1,-1>>>::
        emplace_back<Eigen::Array<double,1,_1,1,1,_1>>
                  ((vector<Eigen::Array<double,1,_1,1,1,_1>,std::allocator<Eigen::Array<double,1,_1,1,1,_1>>>
                    *)__return_storage_ptr__,(Array<double,_1,__1,_1,_1,__1> *)&local_278);
        free(local_278._M_dataplus._M_p);
        i = i + 1;
      } while (i < (long)e[2]._vptr_Entity);
    }
    free(local_258._M_dataplus._M_p);
    return extraout_RAX;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"mismatch between entity dimension and local.rows()",0x32);
  paVar1 = &local_258.field_2;
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"e.RefEl().Dimension() == local.rows()","");
  paVar2 = &local_278.field_2;
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_258,&local_278,0x50,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"false","");
  local_278._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
             ,"");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
  base::AssertionFailed(&local_258,&local_278,0x50,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  abort();
}

Assistant:

std::vector<F_return_type> operator()(const mesh::Entity& e,
                                        const Eigen::MatrixXd& local) const {
    LF_ASSERT_MSG(e.RefEl().Dimension() == local.rows(),
                  "mismatch between entity dimension and local.rows()");
    std::vector<F_return_type> result;
    result.reserve(local.cols());
    auto global_points = e.Geometry()->Global(local);
    for (long i = 0; i < local.cols(); ++i) {
      result.push_back(f_(global_points.col(i)));
    }
    return result;
  }